

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_compute_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkComputePipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *pIVar1;
  bool bVar2;
  VkPipelineBinaryInfoKHR *pVVar3;
  VkPipelineShaderStageCreateInfo *stage;
  VkComputePipelineCreateInfo *new_info;
  WorkItem local_50;
  
  stage = (VkPipelineShaderStageCreateInfo *)pipeline;
  pVVar3 = find_pnext<VkPipelineBinaryInfoKHR>((VkStructureType)create_info->pNext,pipeline);
  if ((pVVar3 == (VkPipelineBinaryInfoKHR *)0x0) || (pVVar3->binaryCount == 0)) {
    bVar2 = shader_stage_is_identifier_only((Fossilize *)&create_info->stage,stage);
    pIVar1 = this->impl;
    if ((bVar2) && (pIVar1->should_record_identifier_only == false)) {
      std::mutex::lock(&pIVar1->record_lock);
      if (pipeline != (VkPipeline)0x0) {
        Impl::push_unregister_locked<VkPipeline_T*>
                  (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
    }
    else {
      std::mutex::lock(&pIVar1->record_lock);
      new_info = (VkComputePipelineCreateInfo *)0x0;
      bVar2 = Impl::copy_compute_pipeline
                        (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                         base_pipeline_count,device,gsmcii,&new_info);
      if (bVar2) {
        local_50.type = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
        local_50.create_info = new_info;
        local_50.handle = (uint64_t)pipeline;
        local_50.custom_hash = custom_hash;
        Impl::push_work_locked(this->impl,&local_50);
      }
      else if (pipeline != (VkPipeline)0x0) {
        Impl::push_unregister_locked<VkPipeline_T*>
                  (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
      if (!bVar2) {
        return false;
      }
      Impl::pump_synchronized_recording(this->impl,this);
    }
  }
  return true;
}

Assistant:

bool StateRecorder::record_compute_pipeline(VkPipeline pipeline, const VkComputePipelineCreateInfo &create_info,
                                            const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                            Hash custom_hash,
                                            VkDevice device,
                                            PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	if (shader_stage_is_identifier_only(create_info.stage) &&
	    !impl->should_record_identifier_only)
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);
		// Have to forget any reference if this API handle is recycled.
		if (pipeline != VK_NULL_HANDLE)
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
		return true;
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkComputePipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_compute_pipeline(&create_info, impl->temp_allocator,
		                                 base_pipelines, base_pipeline_count,
		                                 device, gsmcii,
		                                 &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}